

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFuzzyImageCompare.cpp
# Opt level: O0

deUint32 tcu::distSquaredToNeighbor<4>
                   (Random *rnd,deUint32 pixel,ConstPixelBufferAccess *surface,int x,int y)

{
  deUint32 dVar1;
  int a;
  int a_00;
  int iVar2;
  deBool dVar3;
  float fVar4;
  float fVar5;
  deUint32 sample;
  float dy_1;
  float dx_1;
  int s;
  int dy;
  int dx;
  int d;
  deUint32 minDist;
  int y_local;
  int x_local;
  ConstPixelBufferAccess *surface_local;
  deUint32 pixel_local;
  Random *rnd_local;
  
  dVar1 = readUnorm8<4>(surface,x,y);
  dx = colorDistSquared(pixel,dVar1);
  rnd_local._4_4_ = dx;
  if (dx != 0) {
    for (dy = 0; dy < 8; dy = dy + 1) {
      a = x + distSquaredToNeighbor<4>::s_coords[dy][0];
      a_00 = y + distSquaredToNeighbor<4>::s_coords[dy][1];
      iVar2 = ConstPixelBufferAccess::getWidth(surface);
      dVar3 = deInBounds32(a,0,iVar2);
      if (dVar3 != 0) {
        iVar2 = ConstPixelBufferAccess::getHeight(surface);
        dVar3 = deInBounds32(a_00,0,iVar2);
        if (dVar3 != 0) {
          dVar1 = readUnorm8<4>(surface,a,a_00);
          dVar1 = colorDistSquared(pixel,dVar1);
          dx = de::min<unsigned_int>(dx,dVar1);
          if (dx == 0) {
            return 0;
          }
        }
      }
    }
    for (dy_1 = 0.0; (int)dy_1 < 0x20; dy_1 = (float)((int)dy_1 + 1)) {
      fVar4 = de::Random::getFloat(rnd);
      fVar5 = de::Random::getFloat(rnd);
      dVar1 = bilinearSample<4>(surface,(fVar4 + fVar4 + (float)x) - 0.5,
                                (fVar5 + fVar5 + (float)y) - 0.5);
      dVar1 = colorDistSquared(pixel,dVar1);
      dx = de::min<unsigned_int>(dx,dVar1);
      if (dx == 0) {
        return 0;
      }
    }
    rnd_local._4_4_ = dx;
  }
  return rnd_local._4_4_;
}

Assistant:

static deUint32 distSquaredToNeighbor (de::Random& rnd, deUint32 pixel, const ConstPixelBufferAccess& surface, int x, int y)
{
	// (x, y) + (0, 0)
	deUint32	minDist		= colorDistSquared(pixel, readUnorm8<NumChannels>(surface, x, y));

	if (minDist == 0)
		return minDist;

	// Area around (x, y)
	static const int s_coords[][2] =
	{
		{-1, -1},
		{ 0, -1},
		{+1, -1},
		{-1,  0},
		{+1,  0},
		{-1, +1},
		{ 0, +1},
		{+1, +1}
	};

	for (int d = 0; d < (int)DE_LENGTH_OF_ARRAY(s_coords); d++)
	{
		int dx = x + s_coords[d][0];
		int dy = y + s_coords[d][1];

		if (!deInBounds32(dx, 0, surface.getWidth()) || !deInBounds32(dy, 0, surface.getHeight()))
			continue;

		minDist = de::min(minDist, colorDistSquared(pixel, readUnorm8<NumChannels>(surface, dx, dy)));
		if (minDist == 0)
			return minDist;
	}

	// Random bilinear-interpolated samples around (x, y)
	for (int s = 0; s < 32; s++)
	{
		float dx = (float)x + rnd.getFloat()*2.0f - 0.5f;
		float dy = (float)y + rnd.getFloat()*2.0f - 0.5f;

		deUint32 sample = bilinearSample<NumChannels>(surface, dx, dy);

		minDist = de::min(minDist, colorDistSquared(pixel, sample));
		if (minDist == 0)
			return minDist;
	}

	return minDist;
}